

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexExpanderShader::shadePrimitives
          (VertexExpanderShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  GenericVec4 *varyings;
  int primitiveID;
  VertexPacket *pVVar1;
  int i;
  long lVar2;
  PrimitivePacket *pPVar3;
  ulong uVar4;
  Vector<float,_4> res_1;
  Vector<float,_4> res_2;
  Vec4 yoffset;
  Vec4 offsets [3];
  float local_c8 [4];
  Vec4 local_b8;
  ulong local_a0;
  float local_98 [6];
  PrimitivePacket *local_80;
  ulong local_78;
  ulong local_70;
  float local_68 [14];
  
  if (0 < numPackets) {
    local_78 = (ulong)(uint)numPackets;
    local_70 = (ulong)(uint)verticesIn;
    local_a0 = 0;
    local_80 = packets;
    do {
      if (0 < verticesIn) {
        pPVar3 = local_80 + local_a0;
        uVar4 = 0;
        do {
          local_68[0] = -0.07;
          local_68[1] = -0.01;
          local_68[2] = 0.0;
          local_68[3] = 0.0;
          local_68[4] = 0.03;
          local_68[5] = -0.03;
          local_68[6] = 0.0;
          local_68[7] = 0.0;
          local_68[8] = -0.01;
          local_68[9] = 0.08;
          local_68[10] = 0.0;
          local_68[0xb] = 0.0;
          primitiveID = pPVar3->primitiveIDIn;
          local_b8.m_data[0] = 0.02;
          local_b8.m_data[1] = 0.1;
          local_b8.m_data[2] = 0.0;
          local_b8.m_data[3] = 0.0;
          local_98[0] = 0.0;
          local_98[1] = 0.0;
          local_98[2] = 0.0;
          local_98[3] = 0.0;
          lVar2 = 0;
          do {
            local_98[lVar2] = local_b8.m_data[lVar2] * (float)primitiveID;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          pVVar1 = pPVar3->vertices[uVar4];
          local_c8[0] = 0.0;
          local_c8[1] = 0.0;
          local_c8[2] = 0.0;
          local_c8[3] = 0.0;
          lVar2 = 0;
          do {
            local_c8[lVar2] = (pVVar1->position).m_data[lVar2] + local_68[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          local_b8.m_data[0] = 0.0;
          local_b8.m_data[1] = 0.0;
          local_b8.m_data[2] = 0.0;
          local_b8.m_data[3] = 0.0;
          lVar2 = 0;
          do {
            local_b8.m_data[lVar2] = local_c8[lVar2] + local_98[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          varyings = pVVar1->outputs;
          rr::GeometryEmitter::EmitVertex(output,&local_b8,pVVar1->pointSize,varyings,primitiveID);
          local_c8[0] = 0.0;
          local_c8[1] = 0.0;
          local_c8[2] = 0.0;
          local_c8[3] = 0.0;
          lVar2 = 0;
          do {
            local_c8[lVar2] = (pVVar1->position).m_data[lVar2] + local_68[lVar2 + 4];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          local_b8.m_data[0] = 0.0;
          local_b8.m_data[1] = 0.0;
          local_b8.m_data[2] = 0.0;
          local_b8.m_data[3] = 0.0;
          lVar2 = 0;
          do {
            local_b8.m_data[lVar2] = local_c8[lVar2] + local_98[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          rr::GeometryEmitter::EmitVertex
                    (output,&local_b8,pVVar1->pointSize,varyings,pPVar3->primitiveIDIn);
          local_c8[0] = 0.0;
          local_c8[1] = 0.0;
          local_c8[2] = 0.0;
          local_c8[3] = 0.0;
          lVar2 = 0;
          do {
            local_c8[lVar2] = (pVVar1->position).m_data[lVar2] + local_68[lVar2 + 8];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          local_b8.m_data[0] = 0.0;
          local_b8.m_data[1] = 0.0;
          local_b8.m_data[2] = 0.0;
          local_b8.m_data[3] = 0.0;
          lVar2 = 0;
          do {
            local_b8.m_data[lVar2] = local_c8[lVar2] + local_98[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          rr::GeometryEmitter::EmitVertex
                    (output,&local_b8,pVVar1->pointSize,varyings,pPVar3->primitiveIDIn);
          rr::GeometryEmitter::EndPrimitive(output);
          uVar4 = uVar4 + 1;
        } while (uVar4 != local_70);
      }
      local_a0 = local_a0 + 1;
    } while (local_a0 != local_78);
  }
  return;
}

Assistant:

void VertexExpanderShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(invocationID);

	for (int ndx = 0; ndx < numPackets; ++ndx)
	for (int verticeNdx = 0; verticeNdx < verticesIn; ++verticeNdx)
	{
		const tcu::Vec4 offsets[] =
		{
			tcu::Vec4(-0.07f, -0.01f, 0.0f, 0.0f),
			tcu::Vec4( 0.03f, -0.03f, 0.0f, 0.0f),
			tcu::Vec4(-0.01f,  0.08f, 0.0f, 0.0f)
		};
		const tcu::Vec4 yoffset = float(packets[ndx].primitiveIDIn) * tcu::Vec4(0.02f, 0.1f, 0, 0);

		// Create new primitive at every input vertice
		const rr::VertexPacket* vertex = packets[ndx].vertices[verticeNdx];

		output.EmitVertex(vertex->position + offsets[0] + yoffset, vertex->pointSize, vertex->outputs, packets[ndx].primitiveIDIn);
		output.EmitVertex(vertex->position + offsets[1] + yoffset, vertex->pointSize, vertex->outputs, packets[ndx].primitiveIDIn);
		output.EmitVertex(vertex->position + offsets[2] + yoffset, vertex->pointSize, vertex->outputs, packets[ndx].primitiveIDIn);
		output.EndPrimitive();
	}
}